

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# text_format.cc
# Opt level: O2

string * __thiscall
google::protobuf::TextFormat::FieldValuePrinter::PrintEnum
          (string *__return_storage_ptr__,FieldValuePrinter *this,int32 val,string *name)

{
  std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)name);
  return __return_storage_ptr__;
}

Assistant:

string TextFormat::FieldValuePrinter::PrintEnum(int32 val,
                                                const string& name) const {
  return name;
}